

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall
ON_Layer::CopyPerViewportSettings
          (ON_Layer *this,ON_Layer *source_layer,ON_UUID viewport_id,uint settings_mask)

{
  bool bVar1;
  ON__LayerExtensions *pOVar2;
  long lVar3;
  ON__LayerPerViewSettings *pOVar4;
  ON__LayerPerViewSettings *pOVar5;
  undefined1 in_R9B;
  long lVar6;
  ON_UUID viewport_id_00;
  ON_UUID viewport_id_01;
  ON_UUID viewport_id_02;
  uchar *local_40;
  uchar local_38 [8];
  
  local_38 = viewport_id.Data4;
  local_40 = viewport_id._0_8_;
  if (this != source_layer && settings_mask != 0) {
    bVar1 = ON_UuidIsNil((ON_UUID *)&local_40);
    if (bVar1) {
      pOVar2 = ON__LayerExtensions::LayerExtensions
                         (source_layer,&source_layer->m_extension_bits,false);
      if (pOVar2 == (ON__LayerExtensions *)0x0) {
        return false;
      }
      lVar3 = (long)(pOVar2->m_vp_settings).m_count;
      if (0 < lVar3) {
        lVar6 = 0;
        bVar1 = false;
        do {
          pOVar5 = (pOVar2->m_vp_settings).m_a;
          viewport_id_00.Data4[0] = '\x01';
          viewport_id_00.Data4[1] = '\0';
          viewport_id_00.Data4[2] = '\0';
          viewport_id_00.Data4[3] = '\0';
          viewport_id_00.Data4[4] = '\0';
          viewport_id_00.Data4[5] = '\0';
          viewport_id_00.Data4[6] = '\0';
          viewport_id_00.Data4[7] = '\0';
          viewport_id_00._0_8_ = *(undefined8 *)((pOVar5->m_viewport_id).Data4 + lVar6);
          pOVar4 = ON__LayerExtensions::ViewportSettings
                             ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                              *(uchar **)((pOVar5->m_viewport_id).Data4 + lVar6 + -8),viewport_id_00
                              ,(bool)in_R9B);
          if (pOVar4 != (ON__LayerPerViewSettings *)0x0) {
            ON__LayerPerViewSettings::CopySettings
                      (pOVar4,(ON__LayerPerViewSettings *)
                              ((pOVar5->m_viewport_id).Data4 + lVar6 + -8),settings_mask);
            bVar1 = true;
          }
          lVar6 = lVar6 + 0x28;
        } while (lVar3 * 0x28 != lVar6);
        return bVar1;
      }
    }
    else {
      viewport_id_01.Data4[0] = '\0';
      viewport_id_01.Data4[1] = '\0';
      viewport_id_01.Data4[2] = '\0';
      viewport_id_01.Data4[3] = '\0';
      viewport_id_01.Data4[4] = '\0';
      viewport_id_01.Data4[5] = '\0';
      viewport_id_01.Data4[6] = '\0';
      viewport_id_01.Data4[7] = '\0';
      viewport_id_01._0_8_ = local_38;
      pOVar5 = ON__LayerExtensions::ViewportSettings
                         ((ON__LayerExtensions *)source_layer,
                          (ON_Layer *)&source_layer->m_extension_bits,local_40,viewport_id_01,
                          (bool)in_R9B);
      if (pOVar5 == (ON__LayerPerViewSettings *)0x0) {
        return false;
      }
      viewport_id_02.Data4[0] = '\x01';
      viewport_id_02.Data4[1] = '\0';
      viewport_id_02.Data4[2] = '\0';
      viewport_id_02.Data4[3] = '\0';
      viewport_id_02.Data4[4] = '\0';
      viewport_id_02.Data4[5] = '\0';
      viewport_id_02.Data4[6] = '\0';
      viewport_id_02.Data4[7] = '\0';
      viewport_id_02._0_8_ = local_38;
      pOVar4 = ON__LayerExtensions::ViewportSettings
                         ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,local_40,
                          viewport_id_02,(bool)in_R9B);
      if (pOVar4 != (ON__LayerPerViewSettings *)0x0) {
        ON__LayerPerViewSettings::CopySettings(pOVar4,pOVar5,settings_mask);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Layer::CopyPerViewportSettings( 
    const ON_Layer& source_layer,
    ON_UUID viewport_id,
    unsigned int settings_mask
    )
{
  bool rc = false;
  if ( 0 != settings_mask && this != &source_layer )
  {
    if ( ON_UuidIsNil(viewport_id) )
    {
      // copy per viewport settings for every viewport
      const ON__LayerExtensions* soruce_layer_ud = ON__LayerExtensions::LayerExtensions(source_layer,&source_layer.m_extension_bits,false);
      if ( 0 != soruce_layer_ud )
      {
        const int count = soruce_layer_ud->m_vp_settings.Count();
        for ( int i = 0; i < count; i++ )
        {
          const ON__LayerPerViewSettings& src = soruce_layer_ud->m_vp_settings[i];
          ON__LayerPerViewSettings* dst = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, src.m_viewport_id, true);
          if ( 0 != dst )
          {
            dst->CopySettings(&src,settings_mask);
            rc = true;
          }
        }
      }
    }
    else
    {
      // copy per viewport settings for a specified viewport.
      const ON__LayerPerViewSettings* src = ON__LayerExtensions::ViewportSettings( source_layer, &source_layer.m_extension_bits, viewport_id, false);
      if ( 0 != src )
      {
        ON__LayerPerViewSettings* dst = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, true);
        if ( 0 != dst )
        {
          dst->CopySettings(src,settings_mask);
          rc = true;
        }
      }
    }
  }
  return rc;
}